

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  SDKResult SVar1;
  bool bVar2;
  OutputWorker *pOVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  shared_ptr<MyClientConnection> connection;
  string hostname;
  SDKJsonResult result;
  string local_268 [32];
  undefined1 local_248 [16];
  ostringstream local_238 [376];
  MyClient client;
  
  std::__cxx11::string::string((string *)&hostname,"127.0.0.1",(allocator *)local_248);
  if ((1 < argc) &&
     (std::__cxx11::string::assign((char *)&hostname), (int)Logger.ChannelMinLevel < 3)) {
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::operator<<((ostream *)local_238,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_238,"Server hostname: ");
    std::operator<<((ostream *)local_238,(string *)&hostname);
    std::operator<<((ostream *)local_238,", port: ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_238);
    std::operator<<((ostream *)local_238," - Also broadcasting on the LAN to find server");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(local_238);
  }
  MyClient::MyClient(&client);
  bVar2 = MyClient::Initialize(&client);
  if (bVar2) {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_0010409b;
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::operator<<((ostream *)local_238,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_238,"File sending client started");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
  }
  else {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_0010409b;
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::operator<<((ostream *)local_238,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_238,"File sending server failed to start");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
  }
  std::__cxx11::ostringstream::~ostringstream(local_238);
LAB_0010409b:
  connection.super___shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  connection.super___shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  result._0_8_ = &client;
  std::make_shared<MyClientConnection,MyClient*>((MyClient **)local_248);
  std::__shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&connection.super___shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2> *)local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248 + 8));
  tonk::SDKSocket::Connect
            (&result,&client.super_SDKSocket,
             &(connection.super___shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_SDKConnection,&hostname,0x285d);
  SVar1.Result = result.super_SDKResult.Result;
  if (result.super_SDKResult.Result != Tonk_Success) {
    std::__cxx11::string::string(local_268,(string *)&result.ErrorJson);
    if ((int)Logger.ChannelMinLevel < 3) {
      local_248._0_8_ = Logger.ChannelName;
      local_248._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(local_238);
      std::operator<<((ostream *)local_238,(string *)&Logger.Prefix);
      std::operator<<((ostream *)local_238,"Client connection failed: ");
      std::operator<<((ostream *)local_238,local_268);
      std::operator<<((ostream *)local_238,
                      " - Going to advertise on the LAN looking for connections");
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
      std::__cxx11::ostringstream::~ostringstream(local_238);
    }
    std::__cxx11::string::~string(local_268);
  }
  std::__cxx11::string::~string((string *)&result.ErrorJson);
  uVar5 = 0;
  while (((byte)client.Complete._M_base._M_i & 1) == 0) {
    uVar4 = tonk_time();
    if (1000000 < uVar4 - uVar5) {
      result.super_SDKResult.Result._0_1_ = 100;
      uVar5 = uVar4;
      if (SVar1.Result != Tonk_Success) {
        std::__cxx11::string::string((string *)local_248,"",(allocator *)local_268);
        tonk::SDKSocket::Advertise(&client.super_SDKSocket,(string *)local_248,0x285d,&result,1);
        std::__cxx11::string::~string((string *)local_248);
      }
    }
    local_248._0_8_ = (MyClient *)0xa;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)local_248);
  }
  if ((int)Logger.ChannelMinLevel < 2) {
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::operator<<((ostream *)local_238,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_238,"Client shutdown");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(local_238);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&connection.super___shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tonk::SDKSocket::~SDKSocket(&client.super_SDKSocket);
  if ((int)Logger.ChannelMinLevel < 2) {
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::operator<<((ostream *)local_238,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_238,"Press ENTER key to terminate");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(local_238);
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::operator<<((ostream *)local_238,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_238,"...Key press detected.  Terminating..");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(local_238);
  }
  std::__cxx11::string::~string((string *)&hostname);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    std::string hostname = "127.0.0.1";

    if (argc >= 2) {
        hostname = argv[1];
        Logger.Info("Server hostname: ", hostname, ", port: ", kFileSenderServerPort,
            " - Also broadcasting on the LAN to find server");
    }

    {
        MyClient client;

        if (client.Initialize()) {
            Logger.Debug("File sending client started");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        bool connectionFailed = true;

        std::shared_ptr<MyClientConnection> connection;

        {
            connection = std::make_shared<MyClientConnection>(&client);

            tonk::SDKJsonResult result = client.Connect(connection.get(), hostname, kFileSenderServerPort);

            if (result.Failed())
            {
                Logger.Info("Client connection failed: ", result.ToString(),
                    " - Going to advertise on the LAN looking for connections");
            }
            else
            {
                connectionFailed = false;
            }
        }

        uint64_t LastAdvertisementUsec = 0;

        while (!client.Complete)
        {
            uint64_t nowUsec = tonk_time();

            if (nowUsec - LastAdvertisementUsec > 1000 * 1000)
            {
                LastAdvertisementUsec = nowUsec;

                uint8_t data[1] = {
                    100
                };

                // Broadcast looking for server on LAN if connection failed
                if (connectionFailed) {
                    client.Advertise(TONK_BROADCAST, kFileSenderServerPort, data, 1);
                }
            }

            std::this_thread::sleep_for(std::chrono::milliseconds(10));
        }

        Logger.Debug("Client shutdown");
    }

    Logger.Debug("Press ENTER key to terminate");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}